

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O0

int allphone_search_start(ps_search_t *search)

{
  bin_mdef_t *pbVar1;
  short sVar2;
  bool bVar3;
  hmm_t *local_30;
  phmm_t *p;
  s3cipid_t ci;
  bin_mdef_t *mdef;
  allphone_search_t *allphs;
  ps_search_t *search_local;
  
  pbVar1 = search->acmod->mdef;
  for (p._6_2_ = 0; (int)p._6_2_ < pbVar1->n_ciphone; p._6_2_ = p._6_2_ + 1) {
    for (local_30 = (hmm_t *)(&(search[1].pls)->vt)[(uint)(int)p._6_2_]; local_30 != (hmm_t *)0x0;
        local_30 = *(hmm_t **)(local_30[1].score + 4)) {
      hmm_clear(local_30);
    }
  }
  *(undefined4 *)((long)&search[1].hyp_str + 4) = 0;
  *(undefined4 *)&search[1].dag = 0;
  blkarray_list_reset((blkarray_list_t *)search[1].last_link);
  *(undefined4 *)&search[1].d2p = 0;
  sVar2 = (short)pbVar1->sil;
  if (sVar2 < 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x2b9,"Cannot find CI-phone %s\n","SIL");
    exit(1);
  }
  local_30 = (hmm_t *)(&(search[1].pls)->vt)[sVar2];
  while( true ) {
    bVar3 = false;
    if (local_30 != (hmm_t *)0x0) {
      bVar3 = *(int *)&local_30[1].ctx != (int)sVar2;
    }
    if (!bVar3) break;
    local_30 = *(hmm_t **)(local_30[1].score + 4);
  }
  if (local_30 == (hmm_t *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,700,"Cannot find HMM for %s\n","SIL");
    exit(1);
  }
  hmm_enter(local_30,0,0,*(int *)&search[1].d2p);
  ptmr_reset((ptmr_t *)&search[1].start_wid);
  ptmr_start((ptmr_t *)&search[1].start_wid);
  return 0;
}

Assistant:

int
allphone_search_start(ps_search_t * search)
{
    allphone_search_t *allphs;
    bin_mdef_t *mdef;
    s3cipid_t ci;
    phmm_t *p;

    allphs = (allphone_search_t *) search;
    mdef = search->acmod->mdef;

    /* Reset all HMMs. */
    for (ci = 0; ci < bin_mdef_n_ciphone(mdef); ci++) {
        for (p = allphs->ci_phmm[(unsigned) ci]; p; p = p->next) {
            hmm_clear(&(p->hmm));
        }
    }

    allphs->n_hmm_eval = 0;
    allphs->n_sen_eval = 0;

    /* Free history nodes, if any */
    blkarray_list_reset(allphs->history);

    /* Initialize start state of the SILENCE PHMM */
    allphs->frame = 0;
    ci = bin_mdef_silphone(mdef);
    if (NOT_S3CIPID(ci))
        E_FATAL("Cannot find CI-phone %s\n", S3_SILENCE_CIPHONE);
    for (p = allphs->ci_phmm[ci]; p && (p->pid != ci); p = p->next);
    if (!p)
        E_FATAL("Cannot find HMM for %s\n", S3_SILENCE_CIPHONE);
    hmm_enter(&(p->hmm), 0, 0, allphs->frame);

    ptmr_reset(&allphs->perf);
    ptmr_start(&allphs->perf);

    return 0;
}